

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void TPZFMatrix<std::complex<float>_>::MultAdd
               (complex<float> *ptr,int64_t rows,int64_t cols,TPZFMatrix<std::complex<float>_> *x,
               TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
               complex<float> alpha,complex<float> beta,int opt)

{
  _ComplexT _Var1;
  long lVar2;
  complex<float> *pcVar3;
  ulong uVar4;
  long lVar5;
  complex<float> *pcVar6;
  char *msg1;
  int64_t c;
  long lVar7;
  complex<float> *pcVar8;
  complex<float> *pcVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined8 in_XMM0_Qa;
  float extraout_XMM0_Db;
  float fVar16;
  undefined8 uVar13;
  float extraout_XMM0_Db_00;
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float in_XMM1_Da;
  float fVar17;
  float in_XMM1_Db;
  float fVar18;
  float fVar19;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  
  lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if ((int)alpha._M_value == 0) {
    if (lVar2 != cols) goto LAB_00beb131;
  }
  else if (lVar2 != rows) {
LAB_00beb131:
    msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
    goto LAB_00beb138;
  }
  if (in_XMM1_Da != 0.0 || in_XMM1_Db != 0.0) {
    lVar2 = (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
    msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
    if ((int)alpha._M_value == 0) {
      if (lVar2 != rows) goto LAB_00beb138;
    }
    else if (lVar2 != cols) goto LAB_00beb138;
    if ((y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
        (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) {
LAB_00beb138:
      Error(msg1,(char *)0x0);
      return;
    }
  }
  lVar2 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  lVar11 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  lVar7 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if ((int)alpha._M_value == 0) {
    uVar4 = rows;
    if (lVar2 == rows && lVar11 == lVar7) goto LAB_00beb1ab;
  }
  else {
    uVar4 = cols;
    if (lVar2 == cols && lVar11 == lVar7) goto LAB_00beb1ab;
  }
  (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(z,uVar4);
LAB_00beb1ab:
  if (cols != 0 && rows != 0) {
    lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    if (0 < lVar2) {
      uVar4 = uVar4 & 0xffffffff;
      lVar11 = 0;
      do {
        if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow < 1) ||
           ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
          Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (in_XMM1_Da != 0.0 || in_XMM1_Db != 0.0) {
          if (z != y) {
            memcpy(z->fElem +
                   (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11,
                   y->fElem +
                   (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11,
                   uVar4 * 8);
          }
          if (uVar4 != 0) {
            uVar10 = 0;
            do {
              lVar7 = 0;
              do {
                if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                     (long)uVar10) ||
                   ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar7)) {
                  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar5 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar7;
                pcVar6 = z->fElem;
                fVar17 = (float)pcVar6[lVar5 + uVar10]._M_value;
                fVar18 = (float)(pcVar6[lVar5 + uVar10]._M_value >> 0x20);
                fVar12 = fVar17 * in_XMM1_Da - fVar18 * in_XMM1_Db;
                fVar17 = in_XMM1_Da * fVar18 + in_XMM1_Db * fVar17;
                if ((NAN(fVar12)) && (NAN(fVar17))) {
                  __mulsc3();
                  fVar17 = extraout_XMM0_Db;
                  fVar12 = extraout_XMM0_Da;
                }
                *(float *)&pcVar6[lVar5 + uVar10]._M_value = fVar12;
                *(float *)((long)&pcVar6[lVar5 + uVar10]._M_value + 4) = fVar17;
                lVar7 = lVar7 + 1;
              } while (lVar2 != lVar7);
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar4);
          }
        }
        else if (uVar4 != 0) {
          memset(z->fElem +
                 (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11,0,
                 uVar4 * 8);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar2);
    }
    if (0 < lVar2) {
      local_98 = (float)in_XMM0_Qa;
      fStack_94 = (float)((ulong)in_XMM0_Qa >> 0x20);
      fStack_90 = (float)in_XMM0_Qb;
      fStack_8c = (float)((ulong)in_XMM0_Qb >> 0x20);
      lVar11 = 0;
      do {
        if ((int)alpha._M_value == 0) {
          if (0 < cols) {
            lVar7 = 0;
            do {
              if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow < 1) ||
                 ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
                Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (0 < rows) {
                pcVar8 = z->fElem +
                         (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                         lVar11;
                lVar5 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
                pcVar3 = x->fElem;
                pcVar6 = pcVar8 + rows;
                pcVar9 = ptr + lVar7 * rows;
                do {
                  fVar17 = (float)pcVar9->_M_value;
                  fVar12 = (float)(pcVar9->_M_value >> 0x20);
                  auVar14._0_4_ = fVar17 * local_98;
                  auVar14._4_4_ = fVar12 * fStack_94;
                  auVar14._8_4_ = fStack_90 * 0.0;
                  auVar14._12_4_ = fStack_8c * 0.0;
                  auVar15._4_12_ = auVar14._4_12_;
                  auVar15._0_4_ = auVar14._0_4_ - auVar14._4_4_;
                  uVar13 = auVar15._0_8_;
                  fVar17 = local_98 * fVar12 + fStack_94 * fVar17;
                  if ((NAN(auVar15._0_4_)) && (NAN(fVar17))) {
                    uVar13 = __mulsc3();
                    fVar17 = (float)((ulong)uVar13 >> 0x20);
                  }
                  _Var1 = pcVar3[lVar5 * lVar11 + lVar7]._M_value;
                  fVar18 = (float)_Var1;
                  fVar19 = (float)(_Var1 >> 0x20);
                  fVar12 = (float)uVar13 * fVar18 - fVar19 * fVar17;
                  fVar17 = fVar18 * fVar17 + (float)uVar13 * fVar19;
                  if ((NAN(fVar12)) && (NAN(fVar17))) {
                    uVar13 = __mulsc3();
                    fVar12 = (float)uVar13;
                    fVar17 = (float)((ulong)uVar13 >> 0x20);
                  }
                  pcVar9 = pcVar9 + 1;
                  _Var1 = pcVar8->_M_value;
                  *(float *)&pcVar8->_M_value = (float)_Var1 + fVar12;
                  *(float *)((long)&pcVar8->_M_value + 4) = (float)(_Var1 >> 0x20) + fVar17;
                  pcVar8 = pcVar8 + 1;
                } while (pcVar8 < pcVar6);
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != cols);
          }
        }
        else {
          if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow < 1) ||
             ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (0 < cols) {
            pcVar9 = z->fElem +
                     (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11;
            lVar7 = 0;
            pcVar6 = ptr;
            do {
              if (rows < 1) {
                fVar17 = 0.0;
                fVar12 = 0.0;
              }
              else {
                pcVar8 = x->fElem +
                         (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                         lVar11;
                pcVar3 = pcVar8 + rows;
                fVar17 = 0.0;
                fVar12 = 0.0;
                do {
                  _Var1 = pcVar6->_M_value;
                  fVar18 = *(float *)((long)&pcVar8->_M_value + 4);
                  fVar16 = (float)(_Var1 >> 0x20);
                  fVar19 = *(float *)&pcVar8->_M_value * (float)_Var1 - fVar16 * fVar18;
                  fVar18 = *(float *)&pcVar8->_M_value * fVar16 + (float)_Var1 * fVar18;
                  if ((NAN(fVar19)) && (NAN(fVar18))) {
                    uVar13 = __mulsc3(_Var1,fVar16);
                    fVar19 = (float)uVar13;
                    fVar18 = (float)((ulong)uVar13 >> 0x20);
                  }
                  fVar17 = fVar17 + fVar19;
                  fVar12 = fVar12 + fVar18;
                  pcVar6 = pcVar6 + 1;
                  pcVar8 = pcVar8 + 1;
                } while (pcVar8 < pcVar3);
              }
              fVar18 = fVar17 * local_98 - fVar12 * fStack_94;
              fVar17 = fVar12 * local_98 + fVar17 * fStack_94;
              if ((NAN(fVar18)) && (NAN(fVar17))) {
                __mulsc3();
                fVar18 = extraout_XMM0_Da_00;
                fVar17 = extraout_XMM0_Db_00;
              }
              pcVar9->_M_value =
                   CONCAT44((float)(pcVar9->_M_value >> 0x20) + fVar17,
                            (float)pcVar9->_M_value + fVar18);
              pcVar9 = pcVar9 + 1;
              lVar7 = lVar7 + 1;
            } while (lVar7 != cols);
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar2);
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}